

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rb_aug.c
# Opt level: O2

int main(void)

{
  byte *pbVar1;
  wtree_node **ppwVar2;
  wtree_node *pwVar3;
  int iVar4;
  ulong uVar5;
  void *pvVar6;
  long lVar7;
  ulong *puVar8;
  wtree_node_t *pwVar9;
  wtree_node_t *left__7;
  char *pcVar10;
  wtree_node_t *pwVar11;
  wtree_node *pwVar12;
  anon_struct_16_2_62e9fd8f *pathp__1;
  int *piVar13;
  char **ppcVar14;
  wtree_node_t *left__1;
  wtree_node_t *pwVar15;
  ulong uVar16;
  char *__assertion;
  ulong uVar17;
  int iVar18;
  anon_struct_16_2_62e9fd8f *pathp__2;
  ulong *puVar19;
  undefined8 *puVar20;
  wtree_node_t *left_;
  wtree_node *pwVar21;
  uint uVar22;
  anon_struct_16_2_62e9fd8f *pathp_;
  wtree_node_t *node;
  undefined1 auVar23 [8];
  bool bVar24;
  undefined8 local_a10;
  char *local_a08;
  ulong local_a00;
  undefined1 local_9f8 [8];
  wtree_walk walk;
  wtree_node_t *local_1f0;
  wtree_node_t *left_1;
  wtree_node_t *local_68;
  wtree_node_t *right;
  wtree_node_t *left;
  int local_4c;
  void *local_48;
  wtree_node_t *local_40;
  wtree_node_t *local_38;
  
  plan(1);
  _space((FILE *)_stdout);
  local_40 = (wtree_node_t *)0x0;
  printf("# *** %s ***\n","main");
  uVar5 = time((time_t *)0x0);
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fprintf(_stdout,"random seed is %u",uVar5 & 0xffffffff);
  fputc(10,_stdout);
  srand((uint)uVar5);
  plan(1);
  _space((FILE *)_stdout);
  printf("# *** %s ***\n","check_aug");
  pvVar6 = calloc(3000,8);
  iVar4 = 0;
  pwVar15 = (wtree_node_t *)0x0;
  local_48 = pvVar6;
LAB_001012fb:
  pwVar9 = local_40;
  left = pwVar15;
  if (iVar4 != 3000) {
    auVar23 = (undefined1  [8])pwVar9;
    local_4c = iVar4;
    if (((int)pwVar15 < 1) || (iVar4 = rand(), 0x13 < iVar4 % 100)) {
LAB_00101b07:
      pwVar9 = (wtree_node_t *)malloc(0x18);
      pwVar15 = (wtree_node_t *)(ulong)((int)left + 1);
      *(wtree_node_t **)((long)pvVar6 + (long)(int)left * 8) = pwVar9;
      iVar4 = rand();
      pwVar9->value = iVar4 % 3000 + 1;
      (pwVar9->in_tree).rbn_left = (wtree_node *)0x0;
      (pwVar9->in_tree).rbn_right_red = (wtree_node *)0x1;
      pwVar9->weight = 1;
      local_9f8 = auVar23;
      ppcVar14 = &local_a08;
      local_40 = (wtree_node_t *)auVar23;
      puVar20 = (undefined8 *)local_9f8;
      while (auVar23 != (undefined1  [8])0x0) {
        iVar4 = wtree_node_cmp(pwVar9,(wtree_node_t *)auVar23);
        *(int *)(puVar20 + 1) = iVar4;
        if (iVar4 == 0) {
          __assertion = "cmp != 0";
          pcVar10 = "void wtree_insert(wtree_t *, wtree_node_t *)";
          goto LAB_00102145;
        }
        if (iVar4 < 0) {
          auVar23 = (undefined1  [8])(((wtree_node_t *)auVar23)->in_tree).rbn_left;
        }
        else {
          auVar23 = (undefined1  [8])
                    ((ulong)(((wtree_node_t *)auVar23)->in_tree).rbn_right_red & 0xfffffffffffffffe)
          ;
        }
        puVar20[2] = auVar23;
        puVar20 = puVar20 + 2;
        ppcVar14 = ppcVar14 + 2;
      }
      *puVar20 = pwVar9;
      pvVar6 = local_48;
      for (; iVar4 = local_4c, local_9f8 <= ppcVar14; ppcVar14 = ppcVar14 + -2) {
        pwVar11 = (wtree_node_t *)*ppcVar14;
        if (*(int *)(ppcVar14 + 1) < 0) {
          (pwVar11->in_tree).rbn_left = pwVar9;
          if (((ulong)(pwVar9->in_tree).rbn_right_red & 1) == 0) goto LAB_00101d1c;
          pwVar21 = (pwVar9->in_tree).rbn_left;
          if ((pwVar21 != (wtree_node *)0x0) &&
             (pwVar12 = (pwVar21->in_tree).rbn_right_red, ((ulong)pwVar12 & 1) != 0)) {
            (pwVar21->in_tree).rbn_right_red = (wtree_node *)((ulong)pwVar12 & 0xfffffffffffffffe);
            pwVar12 = (pwVar9->in_tree).rbn_right_red;
            pwVar21 = (wtree_node *)((ulong)pwVar12 & 0xfffffffffffffffe);
            (pwVar11->in_tree).rbn_left = pwVar21;
            (pwVar9->in_tree).rbn_right_red =
                 (wtree_node *)((ulong)((uint)pwVar12 & 1) | (ulong)pwVar11);
            pwVar12 = (pwVar11->in_tree).rbn_right_red;
            goto LAB_00101cb2;
          }
          pwVar21 = (pwVar11->in_tree).rbn_right_red;
          pwVar11->weight = 1;
          iVar4 = pwVar9->weight;
LAB_00101c78:
          pwVar11->weight = iVar4 + 1;
          if (((ulong)pwVar21 & 0xfffffffffffffffe) != 0) {
            pwVar11->weight = iVar4 + 1 + *(int *)(((ulong)pwVar21 & 0xfffffffffffffffe) + 0x14);
          }
        }
        else {
          pwVar21 = (wtree_node *)
                    ((ulong)((uint)(pwVar11->in_tree).rbn_right_red & 1) | (ulong)pwVar9);
          (pwVar11->in_tree).rbn_right_red = pwVar21;
          if (((ulong)(pwVar9->in_tree).rbn_right_red & 1) == 0) goto LAB_00101cfa;
          pwVar12 = (pwVar11->in_tree).rbn_left;
          if ((pwVar12 != (wtree_node *)0x0) &&
             (pwVar3 = (pwVar12->in_tree).rbn_right_red, ((ulong)pwVar3 & 1) != 0)) {
            (pwVar12->in_tree).rbn_right_red = (wtree_node *)((ulong)pwVar3 & 0xfffffffffffffffe);
            ppwVar2 = &(pwVar9->in_tree).rbn_right_red;
            *(byte *)ppwVar2 = *(byte *)ppwVar2 & 0xfe;
            pwVar21 = (pwVar11->in_tree).rbn_right_red;
            (pwVar11->in_tree).rbn_right_red = (wtree_node *)((ulong)pwVar21 | 1);
            pwVar11->weight = 1;
            iVar4 = pwVar12->weight;
            goto LAB_00101c78;
          }
          uVar5 = (ulong)((uint)pwVar21 & 1);
          pwVar9 = (wtree_node_t *)((ulong)pwVar9 & 0xfffffffffffffffe);
          (pwVar11->in_tree).rbn_right_red =
               (wtree_node *)((ulong)(pwVar9->in_tree).rbn_left | uVar5);
          (pwVar9->in_tree).rbn_left = pwVar11;
          (pwVar9->in_tree).rbn_right_red =
               (wtree_node *)((ulong)(pwVar9->in_tree).rbn_right_red & 0xfffffffffffffffe | uVar5);
          pwVar21 = (pwVar11->in_tree).rbn_left;
          pwVar12 = (pwVar11->in_tree).rbn_right_red;
          (pwVar11->in_tree).rbn_right_red = (wtree_node *)((ulong)pwVar12 | 1);
LAB_00101cb2:
          wtree_node_aug(pwVar11,pwVar21,(wtree_node_t *)((ulong)pwVar12 & 0xfffffffffffffffe));
          wtree_node_aug(pwVar9,(pwVar9->in_tree).rbn_left,
                         (wtree_node_t *)
                         ((ulong)(pwVar9->in_tree).rbn_right_red & 0xfffffffffffffffe));
          pwVar11 = pwVar9;
        }
        *ppcVar14 = (char *)pwVar11;
        pwVar9 = pwVar11;
      }
      local_40 = (wtree_node_t *)local_9f8;
      ppwVar2 = &((anon_struct_16_2_6fa94910_for_in_tree *)local_9f8)->rbn_right_red;
      *ppwVar2 = (wtree_node *)((ulong)*ppwVar2 & 0xfffffffffffffffe);
      goto LAB_00101cee;
    }
    iVar4 = rand();
    lVar7 = (long)(iVar4 % (int)left);
    local_38 = *(wtree_node_t **)((long)pvVar6 + lVar7 * 8);
    left = (wtree_node_t *)(ulong)((int)left - 1);
    *(undefined8 *)((long)pvVar6 + lVar7 * 8) = *(undefined8 *)((long)pvVar6 + (long)left * 8);
    *(undefined8 *)((long)pvVar6 + (long)left * 8) = 0;
    local_9f8 = (undefined1  [8])pwVar9;
    piVar13 = &walk.path[0].dir;
    pwVar21 = pwVar9;
    while (pwVar21 != (wtree_node_t *)0x0) {
      iVar4 = wtree_node_cmp(local_38,pwVar21);
      *(int *)&((anon_struct_16_2_62ea00d6 *)(piVar13 + -2))->node = iVar4;
      if (-1 < iVar4) {
        pwVar21 = (wtree_node *)((ulong)(pwVar21->in_tree).rbn_right_red & 0xfffffffffffffffe);
        *(wtree_node **)piVar13 = pwVar21;
        if (iVar4 != 0) goto LAB_001013a1;
        *(undefined4 *)&((anon_struct_16_2_62ea00d6 *)(piVar13 + -2))->node = 1;
        pwVar15 = local_38;
        puVar8 = (ulong *)(piVar13 + -4);
        while (pwVar21 != (wtree_node *)0x0) {
          piVar13[2] = 0xffffffff;
          pwVar21 = (pwVar21->in_tree).rbn_left;
          *(wtree_node **)(piVar13 + 4) = pwVar21;
          piVar13 = piVar13 + 4;
        }
        goto LAB_001013b1;
      }
      pwVar21 = (pwVar21->in_tree).rbn_left;
      *(wtree_node **)piVar13 = pwVar21;
LAB_001013a1:
      piVar13 = piVar13 + 4;
    }
    piVar13 = piVar13 + -4;
    puVar8 = (ulong *)0x0;
    pwVar15 = local_38;
LAB_001013b1:
    if ((wtree_node_t *)*puVar8 == pwVar15) {
      puVar19 = (ulong *)(piVar13 + -4);
      pwVar11 = *(wtree_node_t **)(piVar13 + -4);
      if (pwVar11 != pwVar15) {
        pwVar21 = (pwVar11->in_tree).rbn_right_red;
        uVar5 = (ulong)((uint)(pwVar15->in_tree).rbn_right_red & 1);
        (pwVar11->in_tree).rbn_right_red =
             (wtree_node *)((ulong)pwVar21 & 0xfffffffffffffffe | uVar5);
        (pwVar11->in_tree).rbn_left = (pwVar15->in_tree).rbn_left;
        (pwVar11->in_tree).rbn_right_red =
             (wtree_node *)((ulong)(pwVar15->in_tree).rbn_right_red & 0xfffffffffffffffe | uVar5);
        (pwVar15->in_tree).rbn_right_red =
             (wtree_node *)
             ((ulong)(pwVar15->in_tree).rbn_right_red & 0xfffffffffffffffe |
             (ulong)((uint)pwVar21 & 1));
        *puVar8 = (ulong)pwVar11;
        *puVar19 = (ulong)pwVar15;
        pwVar11 = pwVar15;
        if (puVar8 == (ulong *)local_9f8) {
          auVar23 = (undefined1  [8])*puVar8;
        }
        else if ((int)puVar8[-1] < 0) {
          *(ulong *)puVar8[-2] = *puVar8;
        }
        else {
          *(ulong *)(puVar8[-2] + 8) = (ulong)((uint)*(undefined8 *)(puVar8[-2] + 8) & 1) | *puVar8;
        }
LAB_001014ce:
        if (((ulong)(pwVar11->in_tree).rbn_right_red & 1) == 0) {
          *(undefined8 *)(piVar13 + -4) = 0;
          local_40 = (wtree_node_t *)auVar23;
          for (puVar8 = (ulong *)(piVar13 + -0xc); puVar19 = puVar8 + 2, local_9f8 <= puVar19;
              puVar8 = puVar8 + -2) {
            if ((int)puVar8[3] == 0) {
              __assertion = "pathp->cmp != 0";
              goto LAB_001021e6;
            }
            pwVar21 = (wtree_node *)puVar8[4];
            if (-1 < (int)puVar8[3]) {
              pwVar9 = (wtree_node_t *)*puVar19;
              pwVar11 = (pwVar9->in_tree).rbn_left;
              uVar5 = (ulong)((uint)(pwVar9->in_tree).rbn_right_red & 1);
              (pwVar9->in_tree).rbn_right_red = (wtree_node *)(uVar5 | (ulong)pwVar21);
              pwVar12 = (pwVar11->in_tree).rbn_right_red;
              if (((ulong)pwVar12 & 1) == 0) {
                pwVar3 = (pwVar11->in_tree).rbn_left;
                if (uVar5 == 0 && ((ulong)pwVar21 & 1) == 0) {
                  if ((pwVar3 == (wtree_node *)0x0) ||
                     (pwVar21 = (pwVar3->in_tree).rbn_right_red, ((ulong)pwVar21 & 1) == 0)) {
                    (pwVar11->in_tree).rbn_right_red = (wtree_node *)((ulong)pwVar12 | 1);
                    pwVar21 = (pwVar9->in_tree).rbn_right_red;
                    pwVar9->weight = 1;
                    iVar4 = pwVar11->weight + 1;
                    pwVar9->weight = iVar4;
                    uVar5 = (ulong)pwVar21 & 0xfffffffffffffffe;
                    if (uVar5 != 0) {
                      pwVar9->weight = iVar4 + *(int *)(uVar5 + 0x14);
                    }
                    goto LAB_001015d3;
                  }
                  (pwVar3->in_tree).rbn_right_red =
                       (wtree_node *)((ulong)pwVar21 & 0xfffffffffffffffe);
                  pwVar21 = (pwVar11->in_tree).rbn_right_red;
                  pwVar15 = (wtree_node_t *)((ulong)pwVar21 & 0xfffffffffffffffe);
                  (pwVar9->in_tree).rbn_left = pwVar15;
                  (pwVar11->in_tree).rbn_right_red =
                       (wtree_node *)((ulong)((uint)pwVar21 & 1) | (ulong)pwVar9);
                  wtree_node_aug(pwVar9,pwVar15,
                                 (wtree_node_t *)
                                 ((ulong)(pwVar9->in_tree).rbn_right_red & 0xfffffffffffffffe));
                  wtree_node_aug(pwVar11,(pwVar11->in_tree).rbn_left,
                                 (wtree_node_t *)
                                 ((ulong)(pwVar11->in_tree).rbn_right_red & 0xfffffffffffffffe));
                  pvVar6 = local_48;
                  if (puVar8 + 2 != (ulong *)local_9f8) {
                    if ((int)puVar8[1] < 0) {
                      *(wtree_node_t **)*puVar8 = pwVar11;
                      pwVar11 = (wtree_node_t *)auVar23;
                    }
                    else {
                      *(ulong *)(*puVar8 + 8) =
                           (ulong)((uint)*(undefined8 *)(*puVar8 + 8) & 1) | (ulong)pwVar11;
                      pwVar11 = (wtree_node_t *)auVar23;
                    }
                  }
                  for (; auVar23 = (undefined1  [8])pwVar11, pwVar15 = local_38, local_9f8 <= puVar8
                      ; puVar8 = puVar8 + -2) {
                    pwVar15 = (wtree_node_t *)*puVar8;
                    wtree_node_aug(pwVar15,(pwVar15->in_tree).rbn_left,
                                   (wtree_node_t *)
                                   ((ulong)(pwVar15->in_tree).rbn_right_red & 0xfffffffffffffffe));
                    pwVar11 = (wtree_node_t *)auVar23;
                  }
                }
                else if ((pwVar3 == (wtree_node *)0x0) ||
                        (((ulong)(pwVar3->in_tree).rbn_right_red & 1) == 0)) {
                  (pwVar11->in_tree).rbn_right_red = (wtree_node *)((ulong)pwVar12 | 1);
                  ppwVar2 = &(pwVar9->in_tree).rbn_right_red;
                  *(byte *)ppwVar2 = *(byte *)ppwVar2 & 0xfe;
                  for (; pwVar15 = local_38, pvVar6 = local_48, local_9f8 <= puVar19;
                      puVar19 = puVar19 + -2) {
                    pwVar15 = (wtree_node_t *)*puVar19;
                    wtree_node_aug(pwVar15,(pwVar15->in_tree).rbn_left,
                                   (wtree_node_t *)
                                   ((ulong)(pwVar15->in_tree).rbn_right_red & 0xfffffffffffffffe));
                  }
                }
                else {
                  (pwVar9->in_tree).rbn_right_red =
                       (wtree_node *)((ulong)pwVar21 & 0xfffffffffffffffe);
                  ppwVar2 = &(pwVar11->in_tree).rbn_right_red;
                  *(byte *)ppwVar2 = *(byte *)ppwVar2 | 1;
                  ppwVar2 = &(pwVar3->in_tree).rbn_right_red;
                  *(byte *)ppwVar2 = *(byte *)ppwVar2 & 0xfe;
                  pwVar21 = (pwVar11->in_tree).rbn_right_red;
                  pwVar15 = (wtree_node_t *)((ulong)pwVar21 & 0xfffffffffffffffe);
                  (pwVar9->in_tree).rbn_left = pwVar15;
                  (pwVar11->in_tree).rbn_right_red =
                       (wtree_node *)((ulong)((uint)pwVar21 & 1) | (ulong)pwVar9);
                  wtree_node_aug(pwVar9,pwVar15,
                                 (wtree_node_t *)
                                 ((ulong)(pwVar9->in_tree).rbn_right_red & 0xfffffffffffffffe));
                  wtree_node_aug(pwVar11,(pwVar11->in_tree).rbn_left,
                                 (wtree_node_t *)
                                 ((ulong)(pwVar11->in_tree).rbn_right_red & 0xfffffffffffffffe));
                  pvVar6 = local_48;
                  if (puVar19 <= local_9f8) goto LAB_001021df;
                  if ((int)puVar8[1] < 0) {
                    *(wtree_node_t **)*puVar8 = pwVar11;
                  }
                  else {
                    *(ulong *)(*puVar8 + 8) =
                         (ulong)((uint)*(undefined8 *)(*puVar8 + 8) & 1) | (ulong)pwVar11;
                  }
                  for (; pwVar15 = local_38, local_9f8 <= puVar8; puVar8 = puVar8 + -2) {
                    pwVar15 = (wtree_node_t *)*puVar8;
                    wtree_node_aug(pwVar15,(pwVar15->in_tree).rbn_left,
                                   (wtree_node_t *)
                                   ((ulong)(pwVar15->in_tree).rbn_right_red & 0xfffffffffffffffe));
                  }
                }
              }
              else {
                lVar7 = *(long *)((ulong)pwVar12 & 0xfffffffffffffffe);
                if ((lVar7 == 0) || ((*(ulong *)(lVar7 + 8) & 1) == 0)) {
                  pbVar1 = (byte *)((long *)((ulong)pwVar12 & 0xfffffffffffffffe) + 1);
                  *pbVar1 = *pbVar1 | 1;
                  pwVar21 = (pwVar11->in_tree).rbn_right_red;
                  pwVar15 = (wtree_node_t *)((ulong)pwVar21 & 0xfffffffffffffffe);
                  (pwVar9->in_tree).rbn_left = pwVar15;
                  (pwVar11->in_tree).rbn_right_red =
                       (wtree_node *)((ulong)((uint)pwVar21 & 1) | (ulong)pwVar9);
                  wtree_node_aug(pwVar9,pwVar15,
                                 (wtree_node_t *)
                                 ((ulong)(pwVar9->in_tree).rbn_right_red & 0xfffffffffffffffe));
                  wtree_node_aug(pwVar11,(pwVar11->in_tree).rbn_left,
                                 (wtree_node_t *)
                                 ((ulong)(pwVar11->in_tree).rbn_right_red & 0xfffffffffffffffe));
                  ppwVar2 = &(pwVar11->in_tree).rbn_right_red;
                  *(byte *)ppwVar2 = *(byte *)ppwVar2 & 0xfe;
                  pwVar15 = pwVar11;
                  pwVar9 = (wtree_node_t *)auVar23;
                }
                else {
                  *(ulong *)(lVar7 + 8) = *(ulong *)(lVar7 + 8) & 0xfffffffffffffffe;
                  pwVar21 = (pwVar11->in_tree).rbn_right_red;
                  node = (wtree_node_t *)((ulong)pwVar21 & 0xfffffffffffffffe);
                  (pwVar11->in_tree).rbn_right_red =
                       (wtree_node *)((ulong)((uint)pwVar21 & 1) | (ulong)pwVar9);
                  pwVar21 = (node->in_tree).rbn_right_red;
                  pwVar15 = (wtree_node_t *)((ulong)pwVar21 & 0xfffffffffffffffe);
                  (pwVar9->in_tree).rbn_left = pwVar15;
                  (node->in_tree).rbn_right_red =
                       (wtree_node *)((ulong)((uint)pwVar21 & 1) | (ulong)pwVar9);
                  (pwVar11->in_tree).rbn_right_red =
                       (wtree_node *)
                       ((ulong)((uint)(pwVar11->in_tree).rbn_right_red & 1) | (ulong)node);
                  wtree_node_aug(pwVar9,pwVar15,
                                 (wtree_node_t *)
                                 ((ulong)(pwVar9->in_tree).rbn_right_red & 0xfffffffffffffffe));
                  wtree_node_aug(node,(node->in_tree).rbn_left,
                                 (wtree_node_t *)
                                 ((ulong)(node->in_tree).rbn_right_red & 0xfffffffffffffffe));
                  pwVar21 = (pwVar11->in_tree).rbn_right_red;
                  pwVar15 = (wtree_node_t *)((ulong)pwVar21 & 0xfffffffffffffffe);
                  pwVar12 = (pwVar15->in_tree).rbn_left;
                  (pwVar11->in_tree).rbn_right_red =
                       (wtree_node *)((ulong)((uint)pwVar21 & 1) | (ulong)pwVar12);
                  (pwVar15->in_tree).rbn_left = pwVar11;
                  wtree_node_aug(pwVar11,(pwVar11->in_tree).rbn_left,
                                 (wtree_node_t *)((ulong)pwVar12 & 0xfffffffffffffffe));
                  wtree_node_aug(pwVar15,(pwVar15->in_tree).rbn_left,
                                 (wtree_node_t *)
                                 ((ulong)(pwVar15->in_tree).rbn_right_red & 0xfffffffffffffffe));
                  pwVar9 = local_40;
                }
                pvVar6 = local_48;
                auVar23 = (undefined1  [8])pwVar15;
                if (puVar19 != (ulong *)local_9f8) {
                  auVar23 = (undefined1  [8])pwVar9;
                  if ((int)puVar8[1] < 0) {
                    *(wtree_node_t **)*puVar8 = pwVar15;
                  }
                  else {
                    *(ulong *)(*puVar8 + 8) =
                         (ulong)((uint)*(undefined8 *)(*puVar8 + 8) & 1) | (ulong)pwVar15;
                  }
                }
                for (; pwVar15 = local_38, local_9f8 <= puVar8; puVar8 = puVar8 + -2) {
                  pwVar15 = (wtree_node_t *)*puVar8;
                  wtree_node_aug(pwVar15,(pwVar15->in_tree).rbn_left,
                                 (wtree_node_t *)
                                 ((ulong)(pwVar15->in_tree).rbn_right_red & 0xfffffffffffffffe));
                }
              }
              goto LAB_00101afc;
            }
            pwVar15 = (wtree_node_t *)*puVar19;
            (pwVar15->in_tree).rbn_left = pwVar21;
            pwVar9 = (pwVar15->in_tree).rbn_right_red;
            if (((ulong)pwVar9 & 1) != 0) {
              pwVar9 = (wtree_node_t *)((ulong)pwVar9 & 0xfffffffffffffffe);
              pwVar11 = (pwVar9->in_tree).rbn_left;
              if ((pwVar11 == (wtree_node_t *)0x0) ||
                 (((ulong)(pwVar11->in_tree).rbn_right_red & 1) == 0)) {
                pwVar21 = (wtree_node *)((ulong)pwVar11 | 1);
              }
              else {
                (pwVar15->in_tree).rbn_right_red = pwVar9;
                pwVar21 = (pwVar11->in_tree).rbn_right_red;
                pwVar15 = (wtree_node_t *)((ulong)pwVar21 & 0xfffffffffffffffe);
                (pwVar9->in_tree).rbn_left = pwVar15;
                (pwVar11->in_tree).rbn_right_red =
                     (wtree_node *)((ulong)((uint)pwVar21 & 1) | (ulong)pwVar9);
                wtree_node_aug(pwVar9,pwVar15,
                               (wtree_node_t *)
                               ((ulong)(pwVar9->in_tree).rbn_right_red & 0xfffffffffffffffe));
                wtree_node_aug(pwVar11,(pwVar11->in_tree).rbn_left,
                               (wtree_node_t *)
                               ((ulong)(pwVar11->in_tree).rbn_right_red & 0xfffffffffffffffe));
                pwVar15 = (wtree_node_t *)puVar8[2];
                uVar22 = (uint)pwVar11;
                pwVar9 = (wtree_node_t *)((ulong)pwVar11 & 0xfffffffffffffffe);
                pwVar11 = (pwVar9->in_tree).rbn_left;
                pwVar21 = (wtree_node *)
                          ((ulong)((*(uint *)&(pwVar15->in_tree).rbn_right_red | uVar22) & 1) |
                          (ulong)pwVar11);
              }
              (pwVar15->in_tree).rbn_right_red = pwVar21;
              (pwVar9->in_tree).rbn_left = pwVar15;
              wtree_node_aug(pwVar15,(pwVar15->in_tree).rbn_left,
                             (wtree_node_t *)((ulong)pwVar11 & 0xfffffffffffffffe));
              wtree_node_aug(pwVar9,(pwVar9->in_tree).rbn_left,
                             (wtree_node_t *)
                             ((ulong)(pwVar9->in_tree).rbn_right_red & 0xfffffffffffffffe));
              auVar23 = (undefined1  [8])local_40;
              pvVar6 = local_48;
              if (local_9f8 < puVar8 + 2) {
                if ((int)puVar8[1] < 0) {
                  *(wtree_node_t **)*puVar8 = pwVar9;
                }
                else {
                  *(ulong *)(*puVar8 + 8) =
                       (ulong)((uint)*(undefined8 *)(*puVar8 + 8) & 1) | (ulong)pwVar9;
                }
                for (; pwVar15 = local_38, local_9f8 <= puVar8; puVar8 = puVar8 + -2) {
                  pwVar15 = (wtree_node_t *)*puVar8;
                  wtree_node_aug(pwVar15,(pwVar15->in_tree).rbn_left,
                                 (wtree_node_t *)
                                 ((ulong)(pwVar15->in_tree).rbn_right_red & 0xfffffffffffffffe));
                }
                goto LAB_00101afc;
              }
LAB_001021df:
              __assertion = "(uintptr_t)pathp > (uintptr_t)path";
              goto LAB_001021e6;
            }
            pwVar11 = (pwVar9->in_tree).rbn_left;
            if ((pwVar11 != (wtree_node_t *)0x0) &&
               (pwVar21 = (pwVar11->in_tree).rbn_right_red, ((ulong)pwVar21 & 1) != 0)) {
              pwVar15 = (wtree_node_t *)((ulong)pwVar21 & 0xfffffffffffffffe);
              (pwVar9->in_tree).rbn_left = pwVar15;
              (pwVar11->in_tree).rbn_right_red = pwVar9;
              wtree_node_aug(pwVar9,pwVar15,
                             (wtree_node_t *)
                             ((ulong)(pwVar9->in_tree).rbn_right_red & 0xfffffffffffffffe));
              wtree_node_aug(pwVar11,(pwVar11->in_tree).rbn_left,
                             (wtree_node_t *)
                             ((ulong)(pwVar11->in_tree).rbn_right_red & 0xfffffffffffffffe));
              pwVar15 = (wtree_node_t *)puVar8[2];
              auVar23 = (undefined1  [8])((ulong)pwVar11 & 0xfffffffffffffffe);
              pwVar21 = (((wtree_node_t *)auVar23)->in_tree).rbn_left;
              (pwVar15->in_tree).rbn_right_red =
                   (wtree_node *)
                   ((ulong)((*(uint *)&(pwVar15->in_tree).rbn_right_red | (uint)pwVar11) & 1) |
                   (ulong)pwVar21);
              (((wtree_node_t *)auVar23)->in_tree).rbn_left = pwVar15;
              wtree_node_aug(pwVar15,(pwVar15->in_tree).rbn_left,
                             (wtree_node_t *)((ulong)pwVar21 & 0xfffffffffffffffe));
              wtree_node_aug((wtree_node_t *)auVar23,(((wtree_node_t *)auVar23)->in_tree).rbn_left,
                             (wtree_node_t *)
                             ((ulong)(((wtree_node_t *)auVar23)->in_tree).rbn_right_red &
                             0xfffffffffffffffe));
              pvVar6 = local_48;
              if (puVar8 + 2 != (ulong *)local_9f8) {
                puVar20 = (undefined8 *)*puVar8;
                if ((int)puVar8[1] < 0) {
                  *puVar20 = auVar23;
                  auVar23 = (undefined1  [8])local_40;
                }
                else {
                  puVar20[1] = (ulong)((uint)puVar20[1] & 1) | (ulong)auVar23;
                  auVar23 = (undefined1  [8])local_40;
                }
              }
              for (; pwVar15 = local_38, local_9f8 <= puVar8; puVar8 = puVar8 + -2) {
                pwVar15 = (wtree_node_t *)*puVar8;
                wtree_node_aug(pwVar15,(pwVar15->in_tree).rbn_left,
                               (wtree_node_t *)
                               ((ulong)(pwVar15->in_tree).rbn_right_red & 0xfffffffffffffffe));
              }
              goto LAB_00101afc;
            }
            (pwVar15->in_tree).rbn_right_red = (wtree_node *)((ulong)pwVar11 | 1);
            (pwVar9->in_tree).rbn_left = pwVar15;
            wtree_node_aug(pwVar15,(pwVar15->in_tree).rbn_left,
                           (wtree_node_t *)((ulong)pwVar11 & 0xfffffffffffffffe));
            wtree_node_aug(pwVar9,(pwVar9->in_tree).rbn_left,
                           (wtree_node_t *)
                           ((ulong)(pwVar9->in_tree).rbn_right_red & 0xfffffffffffffffe));
            *puVar19 = (ulong)pwVar9;
            pwVar15 = local_38;
            auVar23 = (undefined1  [8])local_40;
LAB_001015d3:
          }
          pvVar6 = local_48;
          auVar23 = local_9f8;
          if (((ulong)((anon_struct_16_2_6fa94910_for_in_tree *)local_9f8)->rbn_right_red & 1) != 0)
          {
            __assertion = "rbtn_red_get(wtree_node_t, in_tree, rbtree->rbt_root) == false";
            goto LAB_001021e6;
          }
        }
        else {
          if (-1 < piVar13[-6]) {
            __assertion = "pathp[-1].cmp < 0";
            goto LAB_001021e6;
          }
          **(undefined8 **)(piVar13 + -8) = 0;
          for (puVar8 = (ulong *)(piVar13 + -8); pwVar15 = local_38, local_9f8 <= puVar8;
              puVar8 = puVar8 + -2) {
            pwVar15 = (wtree_node_t *)*puVar8;
            wtree_node_aug(pwVar15,(pwVar15->in_tree).rbn_left,
                           (wtree_node_t *)
                           ((ulong)(pwVar15->in_tree).rbn_right_red & 0xfffffffffffffffe));
          }
        }
LAB_00101afc:
        free(pwVar15);
        goto LAB_00101b07;
      }
      auVar23 = (undefined1  [8])(pwVar15->in_tree).rbn_left;
      if (auVar23 == (undefined1  [8])0x0) {
        auVar23 = (undefined1  [8])pwVar9;
        if (puVar19 != (ulong *)local_9f8) goto LAB_001014ce;
        auVar23 = (undefined1  [8])0x0;
        goto LAB_00101afc;
      }
      if (((ulong)(pwVar15->in_tree).rbn_right_red & 1) == 0) {
        pwVar21 = (((wtree_node_t *)auVar23)->in_tree).rbn_right_red;
        if (((ulong)pwVar21 & 1) != 0) {
          (((wtree_node_t *)auVar23)->in_tree).rbn_right_red =
               (wtree_node *)((ulong)pwVar21 & 0xfffffffffffffffe);
          if (puVar19 != (ulong *)local_9f8) {
            puVar8 = (ulong *)(piVar13 + -8);
            if (piVar13[-6] < 0) {
              *(undefined1 (*) [8])*puVar8 = auVar23;
            }
            else {
              *(ulong *)(*puVar8 + 8) =
                   (ulong)((uint)*(undefined8 *)(*puVar8 + 8) & 1) | (ulong)auVar23;
            }
            for (; pwVar15 = local_38, auVar23 = (undefined1  [8])local_40, local_9f8 <= puVar8;
                puVar8 = puVar8 + -2) {
              pwVar15 = (wtree_node_t *)*puVar8;
              wtree_node_aug(pwVar15,(pwVar15->in_tree).rbn_left,
                             (wtree_node_t *)
                             ((ulong)(pwVar15->in_tree).rbn_right_red & 0xfffffffffffffffe));
            }
          }
          goto LAB_00101afc;
        }
        __assertion = "rbtn_red_get(wtree_node_t, in_tree, left)";
      }
      else {
        __assertion = "rbtn_red_get(wtree_node_t, in_tree, node) == false";
      }
    }
    else {
      __assertion = "nodep->node == node";
    }
LAB_001021e6:
    pcVar10 = "void wtree_remove(wtree_t *, wtree_node_t *)";
    goto LAB_00102145;
  }
  if (local_40 == (wtree_node_t *)0x0) {
    uVar5 = 0;
  }
  else {
    uVar5 = 0;
    pwVar21 = local_40;
    do {
      if (uVar5 == 0x30) {
        __assertion = "(it)->count < RB_MAX_TREE_HEIGHT";
        pcVar10 = "void wtree_ifirst(wtree_t *, struct wtree_iterator *)";
LAB_00102145:
        __assert_fail(__assertion,
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rb_aug.c"
                      ,0x40,pcVar10);
      }
      (&local_1f0)[uVar5] = pwVar21;
      uVar5 = uVar5 + 1;
      pwVar21 = (pwVar21->in_tree).rbn_left;
    } while (pwVar21 != (wtree_node *)0x0);
  }
  pwVar15 = (wtree_node_t *)0x0;
  do {
    pwVar9 = pwVar15;
    if ((int)uVar5 == 0) {
LAB_00101e5e:
      walk.path[0x2f].dir = 0;
      local_9f8 = (undefined1  [8])local_40;
      goto LAB_00101e7c;
    }
    pwVar15 = (&local_1f0)[(int)uVar5 - 1];
    uVar16 = uVar5 & 0xffffffff;
    pwVar21 = (wtree_node *)((ulong)(pwVar15->in_tree).rbn_right_red & 0xfffffffffffffffe);
    if (pwVar21 == (wtree_node_t *)0x0) {
      uVar16 = uVar16 + 0xfffffffe;
      pwVar11 = pwVar15;
      do {
        if ((int)uVar5 == 1) {
          uVar5 = 0;
          break;
        }
        uVar17 = uVar16 & 0xffffffff;
        uVar16 = uVar16 - 1;
        uVar5 = (ulong)((int)uVar5 - 1);
        bVar24 = pwVar11 ==
                 (wtree_node_t *)
                 ((ulong)((&local_1f0)[uVar17]->in_tree).rbn_right_red & 0xfffffffffffffffe);
        pwVar11 = (&local_1f0)[uVar17];
      } while (bVar24);
    }
    else {
      do {
        if (0x2f < uVar16) {
          __assertion = "(it)->count < RB_MAX_TREE_HEIGHT";
          pcVar10 = "wtree_node_t *wtree_inext(struct wtree_iterator *)";
          goto LAB_00102145;
        }
        (&local_1f0)[uVar16] = pwVar21;
        uVar16 = uVar16 + 1;
        pwVar21 = (pwVar21->in_tree).rbn_left;
      } while (pwVar21 != (wtree_node *)0x0);
      uVar5 = uVar16 & 0xffffffff;
    }
    if (pwVar15 == (wtree_node_t *)0x0) goto LAB_00101e5e;
  } while ((pwVar9 == (wtree_node_t *)0x0) || (pwVar9->value <= pwVar15->value));
  pcVar10 = "prev->value <= node->value";
  local_a10 = 0x4d;
  goto LAB_00101eec;
LAB_00101cfa:
  for (; local_9f8 <= ppcVar14; ppcVar14 = ppcVar14 + -2) {
    pwVar9 = (wtree_node_t *)*ppcVar14;
    wtree_node_aug(pwVar9,(pwVar9->in_tree).rbn_left,
                   (wtree_node_t *)((ulong)(pwVar9->in_tree).rbn_right_red & 0xfffffffffffffffe));
  }
  goto LAB_00101cee;
LAB_00101d1c:
  for (; local_9f8 <= ppcVar14; ppcVar14 = ppcVar14 + -2) {
    pwVar9 = (wtree_node_t *)*ppcVar14;
    wtree_node_aug(pwVar9,(pwVar9->in_tree).rbn_left,
                   (wtree_node_t *)((ulong)(pwVar9->in_tree).rbn_right_red & 0xfffffffffffffffe));
  }
LAB_00101cee:
  iVar4 = iVar4 + 1;
  goto LAB_001012fb;
  while( true ) {
    iVar4 = 1;
    if (right != (wtree_node_t *)0x0) {
      iVar4 = right->weight + 1;
    }
    if (local_68 == (wtree_node_t *)0x0) {
      iVar18 = 0;
    }
    else {
      iVar18 = local_68->weight;
    }
    if (pwVar15->weight != iVar18 + iVar4) break;
LAB_00101e7c:
    pwVar15 = wtree_walk_next((wtree_walk *)local_9f8,3,&right,&local_68);
    if (pwVar15 == (wtree_node_t *)0x0) {
      iVar4 = 0;
      do {
        if (iVar4 == 100) {
          uVar16 = 0;
          _ok(1,"true",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rb_aug.c",
              0xb5,"line %d",0xb5);
          pvVar6 = local_48;
          uVar5 = (ulong)left & 0xffffffff;
          if ((int)left < 1) {
            uVar5 = uVar16;
          }
          for (; uVar5 != uVar16; uVar16 = uVar16 + 1) {
            free(*(void **)((long)pvVar6 + uVar16 * 8));
          }
          free(pvVar6);
          _space((FILE *)_stdout);
          printf("# *** %s: done ***\n","check_aug");
          check_plan();
          _space((FILE *)_stdout);
          printf("# *** %s: done ***\n","main");
          iVar4 = check_plan();
          return iVar4;
        }
        local_4c = iVar4;
        iVar4 = rand();
        walk.path[0x2f].dir = 0;
        iVar18 = iVar4 % 0x1194 + -0x2ee;
        local_9f8 = (undefined1  [8])local_40;
        local_38 = (wtree_node_t *)((ulong)local_38 & 0xffffffff00000000);
        iVar4 = 0;
        while (pwVar15 = wtree_walk_next((wtree_walk *)local_9f8,iVar4,&local_1f0,&right),
              pwVar15 != (wtree_node_t *)0x0) {
          iVar4 = 1;
          if (pwVar15->value < iVar18) {
            iVar4 = (int)local_38;
            if (local_1f0 != (wtree_node_t *)0x0) {
              iVar4 = (int)local_38 + local_1f0->weight;
            }
            local_38 = (wtree_node_t *)CONCAT44(local_38._4_4_,iVar4 + 1);
            iVar4 = 2;
          }
        }
        uVar16 = 0;
        uVar5 = 0;
        pwVar21 = local_40;
        while (uVar16 = uVar16 + 1, pwVar21 != (wtree_node_t *)0x0) {
          if (uVar16 == 0x31) {
            __assertion = "it->count < RB_MAX_TREE_HEIGHT";
            pcVar10 = "void wtree_isearch_lt(wtree_t *, int, struct wtree_iterator *)";
            goto LAB_00102145;
          }
          iVar4 = pwVar21->value;
          (&local_a00)[uVar16] = (ulong)pwVar21;
          if (iVar4 < iVar18) {
            pwVar21 = (wtree_node *)((ulong)(pwVar21->in_tree).rbn_right_red & 0xfffffffffffffffe);
            uVar5 = uVar16 & 0xffffffff;
          }
          else {
            pwVar21 = (pwVar21->in_tree).rbn_left;
          }
        }
        iVar18 = 0;
        while ((int)uVar5 != 0) {
          puVar8 = *(ulong **)((long)walk.path + (ulong)((int)uVar5 - 1) * 8 + -8);
          uVar16 = *puVar8;
          if (uVar16 == 0) {
            uVar16 = uVar5 + 0xfffffffe;
            do {
              if ((int)uVar5 == 1) {
                uVar5 = 0;
                break;
              }
              puVar19 = *(ulong **)((long)walk.path + (uVar16 & 0xffffffff) * 8 + -8);
              uVar16 = uVar16 - 1;
              uVar5 = (ulong)((int)uVar5 - 1);
              bVar24 = (ulong *)*puVar19 == puVar8;
              puVar8 = puVar19;
            } while (bVar24);
          }
          else {
            do {
              if (0x2f < uVar5) {
                __assertion = "(it)->count < RB_MAX_TREE_HEIGHT";
                pcVar10 = "wtree_node_t *wtree_iprev(struct wtree_iterator *)";
                goto LAB_00102145;
              }
              *(ulong *)((long)walk.path + uVar5 * 8 + -8) = uVar16;
              uVar5 = uVar5 + 1;
              uVar16 = *(ulong *)(uVar16 + 8) & 0xfffffffffffffffe;
            } while (uVar16 != 0);
            uVar5 = uVar5 & 0xffffffff;
          }
          iVar18 = iVar18 + 1;
        }
        iVar4 = local_4c + 1;
      } while ((int)local_38 == iVar18);
      local_a08 = "check_aug";
      pcVar10 = "wtree_rank(&tree, value) == wtree_rank_slow(&tree, value)";
      local_a10 = 0xb3;
      goto LAB_0010206f;
    }
  }
  pcVar10 = "node->weight == left_weight + right_weight + 1";
  local_a10 = 0x58;
LAB_00101eec:
  local_a08 = "wtree_selfcheck";
LAB_0010206f:
  fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n",pcVar10,"false",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rb_aug.c",
          local_a10);
  exit(-1);
}

Assistant:

int main()
{
	plan(1);
	header();

	unsigned int seed = time(NULL);
	note("random seed is %u", seed);
	srand(seed);
	check_aug();

	footer();
	return check_plan();
}